

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiles.hpp
# Opt level: O2

State * __thiscall Tiles::initial(State *__return_storage_ptr__,Tiles *this)

{
  int i;
  int iVar1;
  long lVar2;
  Fatal *this_00;
  
  __return_storage_ptr__->blank = -1;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    iVar1 = *(int *)(this + lVar2 * 4);
    if (iVar1 == 0) {
      __return_storage_ptr__->blank = (char)lVar2;
    }
    __return_storage_ptr__->tiles[lVar2] = (char)iVar1;
  }
  if (-1 < __return_storage_ptr__->blank) {
    iVar1 = mdist(this,(int)__return_storage_ptr__->blank,__return_storage_ptr__->tiles);
    __return_storage_ptr__->h = (char)iVar1;
    return __return_storage_ptr__;
  }
  this_00 = (Fatal *)__cxa_allocate_exception(0x80);
  Fatal::Fatal(this_00,"No blank tile");
  __cxa_throw(this_00,&Fatal::typeinfo,0);
}

Assistant:

State initial() const {
        State s;
        s.blank = -1;
        for (int i = 0; i < Ntiles; i++) {
            if (init[i] == 0)
                s.blank = i;
            s.tiles[i] = init[i];
        }
        if (s.blank < 0)
            throw Fatal("No blank tile");
        s.h = mdist(s.blank, s.tiles);
        return s;
    }